

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseMoveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItem *this_00;
  WindowFrameSection WVar1;
  QGraphicsItem *pQVar2;
  WindowData *pWVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  MouseButtons MVar9;
  uint uVar10;
  QGraphicsWidget *widget;
  QGraphicsLayoutItem *this_01;
  long in_FS_OFFSET;
  double dVar11;
  qreal qVar12;
  qreal qVar13;
  qreal qVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double maxh;
  QPointF QVar21;
  QSizeF QVar22;
  QPointF QVar23;
  QPointF QVar24;
  QPointF QVar25;
  QPointF QVar26;
  QPointF QVar27;
  QSizeF QVar28;
  QSizeF QVar29;
  QSizeF QVar30;
  double local_138;
  double dStack_110;
  qreal local_108;
  qreal qStack_100;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  QSizeF local_78;
  QPointF local_68;
  double local_58;
  double dStack_50;
  QSizeF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
  widget = (QGraphicsWidget *)(pQVar2 + -1);
  if (pQVar2 == (QGraphicsItem *)0x0) {
    widget = (QGraphicsWidget *)0x0;
  }
  ensureWindowData(this);
  MVar9 = QGraphicsSceneMouseEvent::buttons(event);
  if ((((uint)MVar9.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i & 1) == 0) ||
     (((this->windowData)._M_t.
       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       ._M_t.
       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl)->
      hoveredSubControl != SC_TitleBarLabel)) goto switchD_0064f93f_caseD_0;
  this_00 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
  local_68 = QGraphicsSceneMouseEvent::buttonDownScenePos(event,LeftButton);
  QVar21 = QGraphicsItem::mapFromScene(this_00,&local_68);
  dVar19 = QVar21.yp;
  dVar16 = QVar21.xp;
  QVar22 = (QSizeF)QGraphicsSceneMouseEvent::pos(event);
  dVar15 = QVar22.ht;
  dVar11 = QVar22.wd;
  local_68 = QVar21;
  QVar21 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48 = QVar22;
  QVar23 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_68.yp = 0.0;
  local_68.xp = dVar16;
  QVar24 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48.ht = 0.0;
  local_48.wd = dVar11;
  QVar25 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_68.xp = 0.0;
  local_68.yp = dVar19;
  QVar26 = QGraphicsItem::mapToParent(this_00,&local_68);
  local_48.wd = 0.0;
  local_48.ht = dVar15;
  QVar27 = QGraphicsItem::mapToParent(this_00,(QPointF *)&local_48);
  local_68 = (QPointF)ZEXT816(0);
  local_58 = 0.0;
  dStack_50 = 0.0;
  pWVar3 = (this->windowData)._M_t.
           super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ._M_t.
           super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  WVar1 = pWVar3->grabbedSection;
  local_c0 = QVar24.xp;
  local_b8 = QVar24.yp;
  local_d0 = QVar26.xp;
  local_c8 = QVar26.yp;
  local_b0 = QVar21.xp;
  local_a8 = QVar21.yp;
  switch(WVar1) {
  case NoSection:
    goto switchD_0064f93f_caseD_0;
  case LeftSection:
    local_b0 = QVar25.xp - local_c0;
    local_a8 = QVar25.yp - local_b8;
    goto LAB_0064fa0c;
  case TopLeftSection:
    local_b0 = QVar23.xp - local_b0;
    local_a8 = QVar23.yp - local_a8;
LAB_0064fa0c:
    local_68.xp = local_b0 + (pWVar3->startGeometry).xp;
    local_68.yp = local_a8 + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w - (dVar11 - dVar16);
    dStack_50 = (pWVar3->startGeometry).h - (dVar15 - dVar19);
    break;
  case TopSection:
    local_68.xp = (QVar27.xp - local_d0) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar27.yp - local_c8) + (pWVar3->startGeometry).yp;
    dStack_50 = (pWVar3->startGeometry).h - (dVar15 - dVar19);
    local_58 = (pWVar3->startGeometry).w;
    break;
  case TopRightSection:
    local_68.xp = (QVar27.xp - local_d0) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar27.yp - local_c8) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w + (dVar11 - dVar16);
    dStack_50 = (pWVar3->startGeometry).h - (dVar15 - dVar19);
    break;
  case RightSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    qVar12 = (pWVar3->startGeometry).w;
    qVar13 = (pWVar3->startGeometry).h;
    local_58 = dVar11 - dVar16;
    dVar15 = 0.0;
    goto LAB_0064fb00;
  case BottomRightSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    qVar12 = (pWVar3->startGeometry).w;
    qVar13 = (pWVar3->startGeometry).h;
    local_58 = dVar11 - dVar16;
    dVar15 = dVar15 - dVar19;
    goto LAB_0064fb00;
  case BottomSection:
    local_68.xp = (pWVar3->startGeometry).xp;
    local_68.yp = (pWVar3->startGeometry).yp;
    qVar12 = (pWVar3->startGeometry).w;
    qVar13 = (pWVar3->startGeometry).h;
    dVar15 = dVar15 - dVar19;
    local_58 = 0.0;
LAB_0064fb00:
    local_58 = local_58 + qVar12;
    dStack_50 = dVar15 + qVar13;
    break;
  case BottomLeftSection:
    local_68.xp = (QVar25.xp - local_c0) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar25.yp - local_b8) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w - (dVar11 - dVar16);
    dStack_50 = (dVar15 - dVar19) + (pWVar3->startGeometry).h;
    break;
  case TitleBarArea:
    local_68.xp = (QVar23.xp - local_b0) + (pWVar3->startGeometry).xp;
    local_68.yp = (QVar23.yp - local_a8) + (pWVar3->startGeometry).yp;
    local_58 = (pWVar3->startGeometry).w;
    dStack_50 = (pWVar3->startGeometry).h;
    break;
  default:
    goto switchD_0064f93f_default;
  }
  if (WVar1 == NoSection) goto switchD_0064f93f_caseD_0;
switchD_0064f93f_default:
  this_01 = &widget->super_QGraphicsLayoutItem;
  local_48.wd = -1.0;
  local_48.ht = -1.0;
  QVar22 = QGraphicsLayoutItem::effectiveSizeHint(this_01,MinimumSize,&local_48);
  local_78.wd = -1.0;
  local_78.ht = -1.0;
  QVar28 = QGraphicsLayoutItem::effectiveSizeHint(this_01,MaximumSize,&local_78);
  dVar16 = dStack_50;
  dVar15 = local_58;
  qVar12 = QVar28.wd;
  auVar20._8_8_ = dStack_50;
  auVar20._0_8_ = local_58;
  local_138 = local_58;
  auVar20 = minpd((undefined1  [16])QVar28,auVar20);
  auVar20 = maxpd(auVar20,(undefined1  [16])QVar22);
  if (pQVar2 == (QGraphicsItem *)0x0) {
    this_01 = (QGraphicsLayoutItem *)0x0;
  }
  bVar7 = QGraphicsLayoutItemPrivate::hasHeightForWidth((this_01->d_ptr).d);
  bVar8 = QGraphicsLayoutItemPrivate::hasWidthForHeight((this_01->d_ptr).d);
  QVar29 = QGraphicsWidget::size((QGraphicsWidget *)widget);
  QVar30 = QGraphicsWidget::size((QGraphicsWidget *)widget);
  qStack_100 = auVar20._8_8_;
  local_108 = auVar20._0_8_;
  if ((bVar8 || bVar7) && (QVar30.ht != dVar16 || QVar29.wd != dVar15)) {
    qVar13 = qStack_100;
    qVar14 = QVar22.wd;
    if (bVar7) {
      local_138 = dVar16;
      qVar13 = local_108;
      qVar12 = QVar28.ht;
      qVar14 = QVar22.ht;
    }
    qVar12 = minimumHeightForWidth(qVar13,qVar14,qVar12,widget,bVar7);
    if (qVar12 <= local_138) goto LAB_0064fe33;
    QVar22 = QGraphicsWidget::size((QGraphicsWidget *)widget);
    qVar12 = QVar22.wd;
    minimumHeightForWidth(qVar12,qStack_100,QVar22.ht,widget,true);
    dVar16 = local_108;
    do {
      maxh = QVar22.ht;
      dVar15 = QVar22.wd;
      uVar10 = (uint)(dVar15 - dVar16 < 0.1);
      auVar17._0_8_ = CONCAT44((int)(uVar10 << 0x1f) >> 0x1f,(int)(uVar10 << 0x1f) >> 0x1f);
      auVar17._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      auVar17._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      uVar6 = (ulong)maxh & auVar17._8_8_;
      auVar18._0_8_ = ~auVar17._0_8_ & (ulong)dVar16;
      auVar18._8_8_ = ~auVar17._8_8_ & (ulong)qStack_100;
      auVar4._8_4_ = (int)uVar6;
      auVar4._0_8_ = (ulong)dVar15 & auVar17._0_8_;
      auVar4._12_4_ = (int)(uVar6 >> 0x20);
      dVar11 = SUB168(auVar18 | auVar4,0);
      dVar19 = SUB168(auVar18 | auVar4,8);
      dVar15 = (dVar15 - dVar11) * 0.5 + dVar11;
      dVar16 = (maxh - dVar19) * 0.5 + dVar19;
      auVar5._8_4_ = SUB84(dVar16,0);
      auVar5._0_8_ = dVar15;
      auVar5._12_4_ = (int)((ulong)dVar16 >> 0x20);
      qVar13 = minimumHeightForWidth(dVar15,dVar19,maxh,widget,true);
      dStack_110 = auVar5._8_8_;
      QVar29.ht = dStack_110;
      QVar29.wd = dVar15;
      dVar16 = dVar15;
      QVar28 = QVar22;
      if ((qVar13 <= dStack_110) &&
         (bVar7 = dStack_110 < qVar13, dVar16 = dVar11, dStack_110 = dVar19, QVar28 = QVar29, bVar7)
         ) {
        QVar28 = QVar22;
      }
      QVar22 = QVar28;
      qVar13 = QVar22.ht;
      dVar11 = QVar22.wd;
      qStack_100 = dStack_110;
    } while ((dVar11 != dVar16) || (NAN(dVar11) || NAN(dVar16)));
    qVar14 = minimumHeightForWidth(dVar15,dStack_110,qVar13,widget,true);
    QVar28.ht = qVar14;
    QVar28.wd = dVar11;
    if (qVar13 <= qVar14) {
      dVar15 = minimumHeightForWidth(qVar13,local_108,qVar12,widget,false);
      QVar28 = QVar22;
    }
  }
  else {
LAB_0064fe33:
    QVar28.ht = qStack_100;
    QVar28.wd = QVar22.wd;
    dVar15 = local_108;
  }
  dVar16 = QVar28.ht;
  uVar6 = (ulong)DAT_0066f5c0;
  switch(WVar1) {
  case LeftSection:
    local_58 = (double)(int)((double)((ulong)dVar15 & 0x8000000000000000 | uVar6) + dVar15);
    dStack_50 = (pWVar3->startGeometry).h;
    local_68.yp = (pWVar3->startGeometry).yp;
    local_68.xp = ((pWVar3->startGeometry).xp + (pWVar3->startGeometry).w) - local_58;
    break;
  case TopLeftSection:
    local_58 = (double)(int)((double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) +
                            dVar15);
    dStack_50 = (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar16);
    local_68.yp = ((pWVar3->startGeometry).h + (pWVar3->startGeometry).yp) - dStack_50;
    local_68.xp = ((pWVar3->startGeometry).w + (pWVar3->startGeometry).xp) - local_58;
    break;
  case TopSection:
    dStack_50 = (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | uVar6) + dVar16);
    local_58 = (pWVar3->startGeometry).w;
    local_68.yp = ((pWVar3->startGeometry).yp + (pWVar3->startGeometry).h) - dStack_50;
    local_68.xp = (pWVar3->startGeometry).xp;
    break;
  case TopRightSection:
    dVar16 = ((local_68.yp + dStack_50) -
             (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                          dVar16)) - local_68.yp;
    local_68.yp = local_68.yp + dVar16;
    dStack_50 = dStack_50 - dVar16;
    dVar16 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000);
    goto LAB_0064ffec;
  case RightSection:
    dVar16 = (double)((ulong)dVar15 & 0x8000000000000000 | uVar6);
LAB_0064ffec:
    local_58 = (double)(int)(dVar16 + dVar15);
    break;
  case BottomRightSection:
    local_58 = (double)(int)((double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) +
                            dVar15);
    dStack_50 = (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar16);
    break;
  case BottomSection:
    dStack_50 = (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | uVar6) + dVar16);
    break;
  case BottomLeftSection:
    local_58 = (double)(int)((double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) +
                            dVar15);
    dStack_50 = (double)(int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar16);
    local_68.yp = (pWVar3->startGeometry).yp;
    local_68.xp = ((pWVar3->startGeometry).xp + (pWVar3->startGeometry).w) - local_58;
  }
  (**(code **)(*(long *)&widget->super_QGraphicsObject + 0x60))(widget,&local_68);
switchD_0064f93f_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (!(event->buttons() & Qt::LeftButton) || windowData->hoveredSubControl != QStyle::SC_TitleBarLabel)
        return;

    QLineF delta(q->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)), event->pos());
    QLineF parentDelta(q->mapToParent(delta.p1()), q->mapToParent(delta.p2()));
    QLineF parentXDelta(q->mapToParent(QPointF(delta.p1().x(), 0)), q->mapToParent(QPointF(delta.p2().x(), 0)));
    QLineF parentYDelta(q->mapToParent(QPointF(0, delta.p1().y())), q->mapToParent(QPointF(0, delta.p2().y())));

    QRectF newGeometry;
    switch (windowData->grabbedSection) {
    case Qt::LeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::TopSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(0, delta.dy()));
        break;
    case Qt::TopRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentYDelta.dx(), parentYDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(-delta.dx(), delta.dy()));
        break;
    case Qt::RightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), 0));
        break;
    case Qt::BottomRightSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(delta.dx(), delta.dy()));
        break;
    case Qt::BottomSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft(),
                             windowData->startGeometry.size() + QSizeF(0, delta.dy()));
        break;
    case Qt::BottomLeftSection:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentXDelta.dx(), parentXDelta.dy()),
                             windowData->startGeometry.size() - QSizeF(delta.dx(), -delta.dy()));
        break;
    case Qt::TitleBarArea:
        newGeometry = QRectF(windowData->startGeometry.topLeft()
                             + QPointF(parentDelta.dx(), parentDelta.dy()),
                             windowData->startGeometry.size());
        break;
    case Qt::NoSection:
        break;
    }

    if (windowData->grabbedSection != Qt::NoSection) {
        _q_boundGeometryToSizeConstraints(windowData->startGeometry, &newGeometry,
                                          windowData->grabbedSection,
                                          q->effectiveSizeHint(Qt::MinimumSize),
                                          q->effectiveSizeHint(Qt::MaximumSize),
                                          q);
        q->setGeometry(newGeometry);
    }
}